

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_coarsen_overshoot.cpp
# Opt level: O3

Read<signed_char> __thiscall
Omega_h::prevent_coarsen_overshoot_tmp<3,1>
          (Omega_h *this,Mesh *mesh,Real max_length,LOs *cands2edges,Read<signed_char> *cand_codes)

{
  int *piVar1;
  Alloc *pAVar2;
  undefined8 uVar3;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  void *extraout_RDX_02;
  void *pvVar4;
  char *pcVar5;
  char *pcVar6;
  LO size_in;
  size_t sVar7;
  Read<signed_char> RVar8;
  Write<signed_char> out;
  LOs ev2v;
  MetricEdgeLengths<3,_3> measurer;
  type f;
  Adj v2e;
  Write<signed_char> local_170;
  Alloc *local_160;
  void *local_158;
  Write<signed_char> local_150;
  Alloc *local_140;
  element_type *local_138;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_130;
  Read<signed_char> local_128;
  Alloc *local_118;
  element_type *local_110;
  Alloc *local_108;
  element_type *local_100;
  type local_f8;
  Adj local_60;
  
  local_130._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)max_length;
  if ((uint)mesh->dim_ < 4) {
    if (mesh->dim_ == 3) {
      MetricEdgeLengths<3,_1>::MetricEdgeLengths((MetricEdgeLengths<3,_1> *)&local_118,mesh);
      Mesh::ask_verts_of((Mesh *)&local_140,(Int)mesh);
      Mesh::ask_up(&local_60,mesh,0,1);
      pAVar2 = (cands2edges->write_).shared_alloc_.alloc;
      if (((ulong)pAVar2 & 1) == 0) {
        sVar7 = pAVar2->size;
      }
      else {
        sVar7 = (ulong)pAVar2 >> 3;
      }
      local_f8.cands2edges.write_.shared_alloc_.alloc = (Alloc *)&local_f8.cand_codes;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"");
      size_in = (LO)(sVar7 >> 2);
      Write<signed_char>::Write(&local_170,size_in,(string *)&local_f8);
      if (local_f8.cands2edges.write_.shared_alloc_.alloc != (Alloc *)&local_f8.cand_codes) {
        operator_delete(local_f8.cands2edges.write_.shared_alloc_.alloc,
                        (ulong)((long)&((__shared_ptr<const_Omega_h::TagBase,_(__gnu_cxx::_Lock_policy)2>
                                         *)&(local_f8.cand_codes.write_.shared_alloc_.alloc)->size)
                                       ->_M_ptr + 1));
      }
      local_f8.cands2edges.write_.shared_alloc_.alloc = (cands2edges->write_).shared_alloc_.alloc;
      if (((ulong)local_f8.cands2edges.write_.shared_alloc_.alloc & 7) == 0 &&
          local_f8.cands2edges.write_.shared_alloc_.alloc != (Alloc *)0x0) {
        if (entering_parallel == '\x01') {
          local_f8.cands2edges.write_.shared_alloc_.alloc =
               (Alloc *)((local_f8.cands2edges.write_.shared_alloc_.alloc)->size * 8 + 1);
        }
        else {
          (local_f8.cands2edges.write_.shared_alloc_.alloc)->use_count =
               (local_f8.cands2edges.write_.shared_alloc_.alloc)->use_count + 1;
        }
      }
      local_f8.cands2edges.write_.shared_alloc_.direct_ptr =
           (cands2edges->write_).shared_alloc_.direct_ptr;
      local_f8.cand_codes.write_.shared_alloc_.alloc = (cand_codes->write_).shared_alloc_.alloc;
      if (((ulong)local_f8.cand_codes.write_.shared_alloc_.alloc & 7) == 0 &&
          local_f8.cand_codes.write_.shared_alloc_.alloc != (Alloc *)0x0) {
        if (entering_parallel == '\x01') {
          local_f8.cand_codes.write_.shared_alloc_.alloc =
               (Alloc *)((local_f8.cand_codes.write_.shared_alloc_.alloc)->size * 8 + 1);
        }
        else {
          (local_f8.cand_codes.write_.shared_alloc_.alloc)->use_count =
               (local_f8.cand_codes.write_.shared_alloc_.alloc)->use_count + 1;
        }
      }
      local_f8.cand_codes.write_.shared_alloc_.direct_ptr =
           (cand_codes->write_).shared_alloc_.direct_ptr;
      local_f8.ev2v.write_.shared_alloc_.alloc = local_140;
      if (((ulong)local_140 & 7) == 0 && local_140 != (Alloc *)0x0) {
        if (entering_parallel == '\x01') {
          local_f8.ev2v.write_.shared_alloc_.alloc = (Alloc *)(local_140->size * 8 + 1);
        }
        else {
          local_140->use_count = local_140->use_count + 1;
        }
      }
      local_f8.ev2v.write_.shared_alloc_.direct_ptr = local_138;
      local_f8.v2e.super_Graph.a2ab.write_.shared_alloc_.alloc =
           local_60.super_Graph.a2ab.write_.shared_alloc_.alloc;
      if (((ulong)local_60.super_Graph.a2ab.write_.shared_alloc_.alloc & 7) == 0 &&
          local_60.super_Graph.a2ab.write_.shared_alloc_.alloc != (Alloc *)0x0) {
        if (entering_parallel == '\x01') {
          local_f8.v2e.super_Graph.a2ab.write_.shared_alloc_.alloc =
               (Alloc *)((long)(((Graph *)
                                &(local_60.super_Graph.a2ab.write_.shared_alloc_.alloc)->size)->a2ab
                               ).write_.shared_alloc_.alloc * 8 + 1);
        }
        else {
          (local_60.super_Graph.a2ab.write_.shared_alloc_.alloc)->use_count =
               (local_60.super_Graph.a2ab.write_.shared_alloc_.alloc)->use_count + 1;
        }
      }
      local_f8.v2e.super_Graph.a2ab.write_.shared_alloc_.direct_ptr =
           local_60.super_Graph.a2ab.write_.shared_alloc_.direct_ptr;
      local_f8.v2e.super_Graph.ab2b.write_.shared_alloc_.alloc =
           local_60.super_Graph.ab2b.write_.shared_alloc_.alloc;
      if (((ulong)local_60.super_Graph.ab2b.write_.shared_alloc_.alloc & 7) == 0 &&
          local_60.super_Graph.ab2b.write_.shared_alloc_.alloc != (Alloc *)0x0) {
        if (entering_parallel == '\x01') {
          local_f8.v2e.super_Graph.ab2b.write_.shared_alloc_.alloc =
               (Alloc *)((long)(((Graph *)
                                &(local_60.super_Graph.ab2b.write_.shared_alloc_.alloc)->size)->a2ab
                               ).write_.shared_alloc_.alloc * 8 + 1);
        }
        else {
          (local_60.super_Graph.ab2b.write_.shared_alloc_.alloc)->use_count =
               (local_60.super_Graph.ab2b.write_.shared_alloc_.alloc)->use_count + 1;
        }
      }
      local_f8.v2e.super_Graph.ab2b.write_.shared_alloc_.direct_ptr =
           local_60.super_Graph.ab2b.write_.shared_alloc_.direct_ptr;
      local_f8.v2e.codes.write_.shared_alloc_.alloc = local_60.codes.write_.shared_alloc_.alloc;
      if (((ulong)local_60.codes.write_.shared_alloc_.alloc & 7) == 0 &&
          local_60.codes.write_.shared_alloc_.alloc != (Alloc *)0x0) {
        if (entering_parallel == '\x01') {
          local_f8.v2e.codes.write_.shared_alloc_.alloc =
               (Alloc *)((long)(((Graph *)&(local_60.codes.write_.shared_alloc_.alloc)->size)->a2ab)
                               .write_.shared_alloc_.alloc * 8 + 1);
        }
        else {
          (local_60.codes.write_.shared_alloc_.alloc)->use_count =
               (local_60.codes.write_.shared_alloc_.alloc)->use_count + 1;
        }
      }
      local_f8.v2e.codes.write_.shared_alloc_.direct_ptr =
           local_60.codes.write_.shared_alloc_.direct_ptr;
      local_f8.measurer.coords.write_.shared_alloc_.alloc = local_118;
      if (((ulong)local_118 & 7) == 0 && local_118 != (Alloc *)0x0) {
        if (entering_parallel == '\x01') {
          local_f8.measurer.coords.write_.shared_alloc_.alloc = (Alloc *)(local_118->size * 8 + 1);
        }
        else {
          local_118->use_count = local_118->use_count + 1;
        }
      }
      local_f8.measurer.coords.write_.shared_alloc_.direct_ptr = local_110;
      local_f8.measurer.metrics.write_.shared_alloc_.alloc = local_108;
      if (((ulong)local_108 & 7) == 0 && local_108 != (Alloc *)0x0) {
        if (entering_parallel == '\x01') {
          local_f8.measurer.metrics.write_.shared_alloc_.alloc = (Alloc *)(local_108->size * 8 + 1);
        }
        else {
          local_108->use_count = local_108->use_count + 1;
        }
      }
      local_f8.measurer.metrics.write_.shared_alloc_.direct_ptr = local_100;
      local_f8.max_length = (Real)local_130._M_pi;
      local_f8.out.shared_alloc_.alloc = local_170.shared_alloc_.alloc;
      if (((ulong)local_170.shared_alloc_.alloc & 7) == 0 &&
          local_170.shared_alloc_.alloc != (Alloc *)0x0) {
        if (entering_parallel == '\x01') {
          local_f8.out.shared_alloc_.alloc =
               (Alloc *)((local_170.shared_alloc_.alloc)->size * 8 + 1);
        }
        else {
          (local_170.shared_alloc_.alloc)->use_count =
               (local_170.shared_alloc_.alloc)->use_count + 1;
        }
      }
      local_f8.out.shared_alloc_.direct_ptr = local_170.shared_alloc_.direct_ptr;
      parallel_for<Omega_h::prevent_coarsen_overshoot_tmp<3,1>(Omega_h::Mesh*,double,Omega_h::Read<int>,Omega_h::Read<signed_char>)::_lambda(int)_1_>
                (size_in,&local_f8,"prevent_coarsen_overshoot");
      local_150.shared_alloc_.alloc = local_170.shared_alloc_.alloc;
      if (((ulong)local_170.shared_alloc_.alloc & 7) == 0 &&
          local_170.shared_alloc_.alloc != (Alloc *)0x0) {
        if (entering_parallel == '\x01') {
          local_150.shared_alloc_.alloc = (Alloc *)((local_170.shared_alloc_.alloc)->size * 8 + 1);
        }
        else {
          (local_170.shared_alloc_.alloc)->use_count =
               (local_170.shared_alloc_.alloc)->use_count + 1;
        }
      }
      local_150.shared_alloc_.direct_ptr = local_170.shared_alloc_.direct_ptr;
      Read<signed_char>::Read(&local_128,&local_150);
      local_160 = (cands2edges->write_).shared_alloc_.alloc;
      if (((ulong)local_160 & 7) == 0 && local_160 != (Alloc *)0x0) {
        if (entering_parallel == '\x01') {
          local_160 = (Alloc *)(local_160->size * 8 + 1);
        }
        else {
          local_160->use_count = local_160->use_count + 1;
        }
      }
      local_158 = (cands2edges->write_).shared_alloc_.direct_ptr;
      Mesh::sync_subset_array<signed_char>
                ((Mesh *)this,(Int)mesh,(Read<signed_char> *)0x1,(LOs *)&local_128,(char)&local_160,
                 0);
      pAVar2 = local_160;
      if (((ulong)local_160 & 7) == 0 && local_160 != (Alloc *)0x0) {
        piVar1 = &local_160->use_count;
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          Alloc::~Alloc(local_160);
          operator_delete(pAVar2,0x48);
        }
      }
      if (((ulong)local_128.write_.shared_alloc_.alloc & 7) == 0 &&
          local_128.write_.shared_alloc_.alloc != (Alloc *)0x0) {
        piVar1 = &(local_128.write_.shared_alloc_.alloc)->use_count;
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          Alloc::~Alloc(local_128.write_.shared_alloc_.alloc);
          operator_delete(local_128.write_.shared_alloc_.alloc,0x48);
        }
      }
      pAVar2 = local_150.shared_alloc_.alloc;
      if (((ulong)local_150.shared_alloc_.alloc & 7) == 0 &&
          local_150.shared_alloc_.alloc != (Alloc *)0x0) {
        piVar1 = &(local_150.shared_alloc_.alloc)->use_count;
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          Alloc::~Alloc(local_150.shared_alloc_.alloc);
          operator_delete(pAVar2,0x48);
        }
      }
      prevent_coarsen_overshoot_tmp<3,1>(Omega_h::Mesh*,double,Omega_h::Read<int>,Omega_h::Read<signed_char>)
      ::{lambda(int)#1}::~Mesh((_lambda_int__1_ *)&local_f8);
      if (((ulong)local_170.shared_alloc_.alloc & 7) == 0 &&
          local_170.shared_alloc_.alloc != (Alloc *)0x0) {
        piVar1 = &(local_170.shared_alloc_.alloc)->use_count;
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          Alloc::~Alloc(local_170.shared_alloc_.alloc);
          operator_delete(local_170.shared_alloc_.alloc,0x48);
        }
      }
      Adj::~Adj(&local_60);
      pvVar4 = extraout_RDX;
      if (((ulong)local_140 & 7) == 0 && local_140 != (Alloc *)0x0) {
        piVar1 = &local_140->use_count;
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          Alloc::~Alloc(local_140);
          operator_delete(local_140,0x48);
          pvVar4 = extraout_RDX_00;
        }
      }
      if (((ulong)local_108 & 7) == 0 && local_108 != (Alloc *)0x0) {
        piVar1 = &local_108->use_count;
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          Alloc::~Alloc(local_108);
          operator_delete(local_108,0x48);
          pvVar4 = extraout_RDX_01;
        }
      }
      if (((ulong)local_118 & 7) == 0 && local_118 != (Alloc *)0x0) {
        piVar1 = &local_118->use_count;
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          Alloc::~Alloc(local_118);
          operator_delete(local_118,0x48);
          pvVar4 = extraout_RDX_02;
        }
      }
      RVar8.write_.shared_alloc_.direct_ptr = pvVar4;
      RVar8.write_.shared_alloc_.alloc = (Alloc *)this;
      return (Read<signed_char>)RVar8.write_.shared_alloc_;
    }
    pcVar6 = "mesh->dim() == mesh_dim";
    pcVar5 = 
    "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_coarsen_overshoot.cpp"
    ;
    uVar3 = 0xe;
  }
  else {
    pcVar6 = "0 <= dim_ && dim_ <= 3";
    pcVar5 = 
    "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_mesh.hpp"
    ;
    uVar3 = 0x33;
  }
  fail("assertion %s failed at %s +%d\n",pcVar6,pcVar5,uVar3);
}

Assistant:

Read<I8> prevent_coarsen_overshoot_tmp(
    Mesh* mesh, Real max_length, LOs cands2edges, Read<I8> cand_codes) {
  OMEGA_H_CHECK(mesh->dim() == mesh_dim);
  MetricEdgeLengths<mesh_dim, metric_dim> measurer(mesh);
  auto ev2v = mesh->ask_verts_of(EDGE);
  auto v2e = mesh->ask_up(VERT, EDGE);
  auto ncands = cands2edges.size();
  auto out = Write<I8>(ncands);
  auto f = OMEGA_H_LAMBDA(LO cand) {
    auto e = cands2edges[cand];
    auto code = cand_codes[cand];
    for (Int eev_col = 0; eev_col < 2; ++eev_col) {
      if (!collapses(code, eev_col)) continue;
      auto v_col = ev2v[e * 2 + eev_col];
      auto eev_onto = 1 - eev_col;
      auto v_onto = ev2v[e * 2 + eev_onto];
      for (auto ve = v2e.a2ab[v_col]; ve < v2e.a2ab[v_col + 1]; ++ve) {
        auto e2 = v2e.ab2b[ve];
        if (e2 == e) continue;
        auto e2_code = v2e.codes[ve];
        auto eev_in = code_which_down(e2_code);
        auto eev_out = 1 - eev_in;
        Few<LO, 2> new_edge;
        new_edge[eev_in] = v_onto;
        new_edge[eev_out] = ev2v[e2 * 2 + eev_out];
        auto length = measurer.measure(new_edge);
        if (length >= max_length) {
          code = dont_collapse(code, eev_col);
          break;
        }
      }
    }
    out[cand] = code;
  };
  parallel_for(ncands, f, "prevent_coarsen_overshoot");
  return mesh->sync_subset_array(
      EDGE, Read<I8>(out), cands2edges, I8(DONT_COLLAPSE), 1);
}